

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack21_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *in;
  *out = uVar1 & 0x1fffff;
  out[1] = uVar1 >> 0x15;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x15 | (uVar2 & 0x3ff) << 0xb;
  out[2] = uVar2 >> 10 & 0x1fffff;
  out[3] = uVar2 >> 0x1f;
  uVar1 = in[2];
  uVar3 = in[3];
  out[3] = uVar2 >> 0x1f | (uVar1 & 0xfffff) << 1;
  out[4] = uVar1 >> 0x14;
  out[4] = uVar1 >> 0x14 | (uVar3 & 0x1ff) << 0xc;
  out[5] = uVar3 >> 9 & 0x1fffff;
  out[6] = uVar3 >> 0x1e;
  uVar1 = in[4];
  out[6] = uVar3 >> 0x1e | (uVar1 & 0x7ffff) << 2;
  uVar2 = in[5];
  out[7] = uVar1 >> 0x13;
  out[7] = (uVar2 & 0xff) << 0xd | uVar1 >> 0x13;
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack21_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 10)) << (21 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 21);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 20)) << (21 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 9)) << (21 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 21);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 19)) << (21 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 8)) << (21 - 8);
  out++;

  return in + 1;
}